

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

int __thiscall
Mapper::calculateSizeRequirement
          (Mapper *this,string *label,uint instructionIndex,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *labelMap,vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions)

{
  ulong uVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  ulong uVar4;
  uint local_8c;
  int unAssembled_1;
  size_t instructionLength_1;
  uint i_1;
  int unAssembled;
  size_t instructionLength;
  long lStack_68;
  uint i;
  int64_t delta;
  out_of_range anon_var_0;
  size_t labelIndex;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *labelMap_local;
  uint instructionIndex_local;
  string *label_local;
  Mapper *this_local;
  
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at(labelMap,label);
  uVar1 = *pmVar2;
  if (uVar1 == instructionIndex) {
    this_local._4_4_ = 0;
  }
  else {
    if (instructionIndex < uVar1) {
      lStack_68 = 10;
      for (instructionLength._4_4_ = instructionIndex + 1; instructionLength._4_4_ < uVar1;
          instructionLength._4_4_ = instructionLength._4_4_ + 1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(ulong)instructionLength._4_4_);
        uVar4 = (ulong)pvVar3->length;
        if (uVar4 != 0) {
          lStack_68 = uVar4 + lStack_68;
        }
        instructionLength_1._4_4_ = (uint)(uVar4 == 0);
        if (instructionLength_1._4_4_ != 0) {
          lStack_68 = (long)(int)instructionLength_1._4_4_ * 10 + lStack_68;
        }
      }
    }
    else {
      lStack_68 = 0;
      for (instructionLength_1._0_4_ = instructionIndex - 1; uVar1 <= (uint)instructionLength_1;
          instructionLength_1._0_4_ = (uint)instructionLength_1 - 1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(ulong)(uint)instructionLength_1);
        uVar4 = (ulong)pvVar3->length;
        if (uVar4 != 0) {
          lStack_68 = uVar4 + lStack_68;
        }
        local_8c = (uint)(uVar4 == 0);
        if (local_8c != 0) {
          lStack_68 = (long)(int)local_8c * 10 + lStack_68;
        }
        if ((uint)instructionLength_1 == 0) break;
      }
      lStack_68 = -lStack_68;
    }
    if ((lStack_68 < -0x80) || (0x7f < lStack_68)) {
      if ((lStack_68 < -0x8000) || (0x7fff < lStack_68)) {
        if ((lStack_68 < -0x80000000) || (0x7fffffff < lStack_68)) {
          this_local._4_4_ = 8;
          if (0 < lStack_68) {
            this_local._4_4_ = 10;
          }
        }
        else {
          this_local._4_4_ = 4;
          if (0 < lStack_68) {
            this_local._4_4_ = 6;
          }
        }
      }
      else {
        this_local._4_4_ = 2;
        if (0 < lStack_68) {
          this_local._4_4_ = 4;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
      if (0 < lStack_68) {
        this_local._4_4_ = 3;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Mapper::calculateSizeRequirement(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> instructions) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return 0;
	}
	if (labelIndex == instructionIndex) {
		return 0;
	}
	int64_t delta;
	if (labelIndex > instructionIndex) {
		delta = sizeof(uint64_t) + 2; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex + 1; i < labelIndex; i++) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
		}
	}
	else {
		delta = 0;
		for (unsigned int i = instructionIndex - 1; i >= labelIndex; i--) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
			if (i == 0)
				break;
		}
		delta = -delta;
	}
	if (SCHAR_MIN <= delta && delta <= SCHAR_MAX) {
		return (delta > 0) ? (sizeof(int8_t) + 2) : sizeof(int8_t);
	}
	else if (SHRT_MIN <= delta && delta <= SHRT_MAX) {
		return (delta > 0) ? (sizeof(int16_t) + 2) : sizeof(int16_t);
	}
	else if (INT32_MIN <= delta && delta <= INT32_MAX) {
		return (delta > 0) ? (sizeof(int32_t) + 2) : sizeof(int32_t);
	}
	return (delta > 0) ? (2 + sizeof(int64_t)) : sizeof(int64_t);
}